

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O0

int uudecode_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  int iVar1;
  byte *pbVar2;
  ssize_t sVar3;
  archive_read_filter *nl_00;
  long lVar4;
  long lVar5;
  byte *pbVar6;
  ssize_t *in_RSI;
  uchar **in_RDI;
  size_t nbytes_read;
  int firstline;
  int l;
  ssize_t nl;
  ssize_t len;
  ssize_t ravail;
  ssize_t avail;
  uchar *b;
  int local_48;
  uint local_44;
  long local_40;
  ssize_t *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  archive_read_filter *nbytes_read_00;
  archive_read_filter *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pbVar2 = (byte *)__archive_read_filter_ahead
                             (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                              in_stack_ffffffffffffffc8);
  if (pbVar2 == (byte *)0x0) {
    return 0;
  }
  local_48 = 0x14;
  nbytes_read_00 = in_stack_ffffffffffffffd8;
  nl_00 = in_stack_ffffffffffffffd8;
  while( true ) {
    sVar3 = bid_get_line((archive_read_filter *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI
                         ,(ssize_t *)pbVar2,&nl_00->position,(size_t *)nbytes_read_00);
    if ((sVar3 < 0) || (local_40 == 0)) {
      return 0;
    }
    if ((sVar3 - local_40 < 0xb) || (iVar1 = memcmp(pbVar2,"begin ",6), iVar1 != 0)) {
      if ((sVar3 - local_40 < 0x12) || (iVar1 = memcmp(pbVar2,"begin-base64 ",0xd), iVar1 != 0)) {
        local_44 = 0;
      }
      else {
        local_44 = 0xd;
      }
    }
    else {
      local_44 = 6;
    }
    if ((local_44 != 0) &&
       (((((pbVar2[(int)local_44] < 0x30 || (0x37 < pbVar2[(int)local_44])) ||
          (pbVar2[(int)(local_44 + 1)] < 0x30)) ||
         ((0x37 < pbVar2[(int)(local_44 + 1)] || (pbVar2[(int)(local_44 + 2)] < 0x30)))) ||
        ((0x37 < pbVar2[(int)(local_44 + 2)] || (pbVar2[(int)(local_44 + 3)] != 0x20)))))) {
      local_44 = 0;
    }
    pbVar2 = pbVar2 + sVar3;
    nl_00 = (archive_read_filter *)((long)nl_00 - sVar3);
    if (local_44 != 0) break;
    local_48 = 0;
    if ((archive_read_filter *)0x1ffff < in_stack_ffffffffffffffd8) {
      return 0;
    }
  }
  if (nl_00 == (archive_read_filter *)0x0) {
    return 0;
  }
  lVar4 = bid_get_line((archive_read_filter *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI,
                       (ssize_t *)pbVar2,(ssize_t *)nl_00,(size_t *)nbytes_read_00);
  if ((lVar4 < 0) || (local_40 == 0)) {
    return 0;
  }
  lVar5 = (long)nl_00 - lVar4;
  if (local_44 == 6) {
    if (""[*pbVar2] == '\0') {
      return 0;
    }
    local_44 = *pbVar2 - 0x20 & 0x3f;
    lVar4 = lVar4 + -1;
    pbVar2 = pbVar2 + 1;
    if (0x2d < local_44) {
      return 0;
    }
    while (local_44 != 0 && 0 < lVar4 - local_40) {
      if (0 < (int)local_44) {
        pbVar6 = pbVar2 + 1;
        if (""[*pbVar2] == '\0') {
          return 0;
        }
        pbVar2 = pbVar2 + 2;
        if (""[*pbVar6] == '\0') {
          return 0;
        }
        lVar4 = lVar4 + -2;
        local_44 = local_44 - 1;
      }
      pbVar6 = pbVar2;
      if (0 < (int)local_44) {
        pbVar6 = pbVar2 + 1;
        if (""[*pbVar2] == '\0') {
          return 0;
        }
        lVar4 = lVar4 + -1;
        local_44 = local_44 - 1;
      }
      pbVar2 = pbVar6;
      if (0 < (int)local_44) {
        pbVar2 = pbVar6 + 1;
        if (""[*pbVar6] == '\0') {
          return 0;
        }
        lVar4 = lVar4 + -1;
        local_44 = local_44 - 1;
      }
    }
    if (lVar4 - local_40 < 0) {
      return 0;
    }
    if ((lVar4 - local_40 == 1) && ((""[*pbVar2] != '\0' || ((0x60 < *pbVar2 && (*pbVar2 < 0x7b)))))
       ) {
      pbVar2 = pbVar2 + 1;
      lVar4 = lVar4 + -1;
    }
    pbVar2 = pbVar2 + local_40;
    if ((lVar5 != 0) && (""[*pbVar2] != '\0')) {
      return local_48 + 0x1e;
    }
  }
  if (local_44 == 0xd) {
    for (; 0 < lVar4 - local_40; lVar4 = lVar4 + -1) {
      if (""[*pbVar2] == '\0') {
        return 0;
      }
      pbVar2 = pbVar2 + 1;
    }
    pbVar2 = pbVar2 + local_40;
    if ((4 < lVar5) && (iVar1 = memcmp(pbVar2,"====\n",5), iVar1 == 0)) {
      return local_48 + 0x28;
    }
    if ((5 < lVar5) && (iVar1 = memcmp(pbVar2,"====\r\n",6), iVar1 == 0)) {
      return local_48 + 0x28;
    }
    if ((0 < lVar5) && (""[*pbVar2] != '\0')) {
      return local_48 + 0x1e;
    }
  }
  return 0;
}

Assistant:

static int
uudecode_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *b;
	ssize_t avail, ravail;
	ssize_t len, nl;
	int l;
	int firstline;
	size_t nbytes_read;

	(void)self; /* UNUSED */

	b = __archive_read_filter_ahead(filter, 1, &avail);
	if (b == NULL)
		return (0);

	firstline = 20;
	ravail = avail;
	nbytes_read = avail;
	for (;;) {
		len = bid_get_line(filter, &b, &avail, &ravail, &nl, &nbytes_read);
		if (len < 0 || nl == 0)
			return (0); /* No match found. */
		if (len - nl >= 11 && memcmp(b, "begin ", 6) == 0)
			l = 6;
		else if (len -nl >= 18 && memcmp(b, "begin-base64 ", 13) == 0)
			l = 13;
		else
			l = 0;

		if (l > 0 && (b[l] < '0' || b[l] > '7' ||
		    b[l+1] < '0' || b[l+1] > '7' ||
		    b[l+2] < '0' || b[l+2] > '7' || b[l+3] != ' '))
			l = 0;

		b += len;
		avail -= len;
		if (l)
			break;
		firstline = 0;

		/* Do not read more than UUENCODE_BID_MAX_READ bytes */
		if (nbytes_read >= UUENCODE_BID_MAX_READ)
			return (0);
	}
	if (!avail)
		return (0);
	len = bid_get_line(filter, &b, &avail, &ravail, &nl, &nbytes_read);
	if (len < 0 || nl == 0)
		return (0);/* There are non-ascii characters. */
	avail -= len;

	if (l == 6) {
		if (!uuchar[*b])
			return (0);
		/* Get a length of decoded bytes. */
		l = UUDECODE(*b++); len--;
		if (l > 45)
			/* Normally, maximum length is 45(character 'M'). */
			return (0);
		while (l && len-nl > 0) {
			if (l > 0) {
				if (!uuchar[*b++])
					return (0);
				if (!uuchar[*b++])
					return (0);
				len -= 2;
				--l;
			}
			if (l > 0) {
				if (!uuchar[*b++])
					return (0);
				--len;
				--l;
			}
			if (l > 0) {
				if (!uuchar[*b++])
					return (0);
				--len;
				--l;
			}
		}
		if (len-nl < 0)
			return (0);
		if (len-nl == 1 &&
		    (uuchar[*b] ||		 /* Check sum. */
		     (*b >= 'a' && *b <= 'z'))) {/* Padding data(MINIX). */
			++b;
			--len;
		}
		b += nl;
		if (avail && uuchar[*b])
			return (firstline+30);
	}
	if (l == 13) {
		while (len-nl > 0) {
			if (!base64[*b++])
				return (0);
			--len;
		}
		b += nl;

		if (avail >= 5 && memcmp(b, "====\n", 5) == 0)
			return (firstline+40);
		if (avail >= 6 && memcmp(b, "====\r\n", 6) == 0)
			return (firstline+40);
		if (avail > 0 && base64[*b])
			return (firstline+30);
	}

	return (0);
}